

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memarena.cpp
# Opt level: O0

void * __thiscall FMemArena::Alloc(FMemArena *this,size_t size)

{
  void *pvVar1;
  Block *this_00;
  void *res;
  Block *block;
  size_t size_local;
  FMemArena *this_local;
  
  res = this->TopBlock;
  while( true ) {
    if (res == (void *)0x0) {
      this_00 = AddBlock(this,size);
      pvVar1 = Block::Alloc(this_00,size);
      return pvVar1;
    }
    pvVar1 = Block::Alloc((Block *)res,size);
    if (pvVar1 != (void *)0x0) break;
    res = *res;
  }
  return pvVar1;
}

Assistant:

void *FMemArena::Alloc(size_t size)
{
	Block *block;

	for (block = TopBlock; block != NULL; block = block->NextBlock)
	{
		void *res = block->Alloc(size);
		if (res != NULL)
		{
			return res;
		}
	}
	block = AddBlock(size);
	return block->Alloc(size);
}